

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_long,unsigned_long>
          (Thread *this,BinopFunc<unsigned_long,_unsigned_long> *f)

{
  unsigned_long uVar1;
  u8 i;
  long lVar2;
  Value VVar3;
  SR result;
  Simd<unsigned_long,_(unsigned_char)__x02_> lhs;
  anon_union_16_6_113bff37_for_Value_0 local_40;
  anon_union_16_6_113bff37_for_Value_0 local_30;
  
  VVar3 = Pop(this);
  local_30.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  do {
    uVar1 = (*f)(*(unsigned_long *)((long)&local_30 + lVar2 * 8),VVar3.field_0.i64_ & 0xffffffff);
    *(unsigned_long *)((long)&local_40 + lVar2 * 8) = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  Push(this,(Value)local_40.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}